

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O2

int minimalFlip1(word *pInOut,word *pMinimal,word *PDuplicat,int nVars)

{
  int iVar1;
  int iVar2;
  word *__src;
  word *__dest;
  size_t __n;
  
  iVar1 = Kit_TruthWordNum_64bit(nVars);
  __n = (size_t)(iVar1 << 3);
  memcpy(pMinimal,pInOut,__n);
  memcpy(PDuplicat,pInOut,__n);
  Kit_TruthChangePhase_64bit(pInOut,nVars,0);
  for (iVar1 = 1; iVar2 = memCompare(pMinimal,pInOut,nVars), iVar1 < nVars; iVar1 = iVar1 + 1) {
    __src = pMinimal;
    __dest = pInOut;
    if (iVar2 == 1) {
      __src = pInOut;
      __dest = pMinimal;
    }
    memcpy(__dest,__src,__n);
    Kit_TruthChangePhase_64bit(pInOut,nVars,iVar1);
  }
  if (iVar2 == -1) {
    memcpy(pInOut,pMinimal,__n);
  }
  iVar1 = bcmp(pInOut,PDuplicat,__n);
  return (int)(iVar1 != 0);
}

Assistant:

int minimalFlip1(word* pInOut, word* pMinimal, word* PDuplicat, int  nVars) 
{
    int i;
    int blockSize = Kit_TruthWordNum_64bit( nVars )*sizeof(word);
    memcpy(pMinimal, pInOut, blockSize);
    memcpy(PDuplicat, pInOut, blockSize);
    Kit_TruthChangePhase_64bit( pInOut, nVars, 0 );
    for(i=1;i<nVars;i++)
    {
        if( memCompare(pMinimal,pInOut,nVars) == 1)
        {
            memcpy(pMinimal, pInOut, blockSize);
            Kit_TruthChangePhase_64bit( pInOut, nVars, i );
        }
        else
        {
            memcpy(pInOut, pMinimal, blockSize);
            Kit_TruthChangePhase_64bit( pInOut, nVars, i );
        }
    }
    if( memCompare(pMinimal,pInOut,nVars) == -1)
        memcpy(pInOut, pMinimal, blockSize);
    if(memcmp(pInOut,PDuplicat,blockSize) == 0)
        return 0;
    else
        return 1;
}